

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsExecuter.cpp
# Opt level: O0

void __thiscall Refal2::COperationsExecuter::allocateTableAndStack(COperationsExecuter *this)

{
  TTableIndex TVar1;
  TStackIndex TVar2;
  element_type *peVar3;
  CStackData *pCVar4;
  void *memory;
  int tableBytes;
  int stackBytes;
  COperationsExecuter *this_local;
  
  peVar3 = std::__shared_ptr_access<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&(this->super_CExecutionContext).Program);
  TVar1 = CCompilationContext::MaxTableSize(&peVar3->super_CCompilationContext);
  if (1 < TVar1) {
    peVar3 = std::__shared_ptr_access<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_CExecutionContext).Program);
    TVar2 = CCompilationContext::MaxStackDepth(&peVar3->super_CCompilationContext);
    peVar3 = std::__shared_ptr_access<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_CExecutionContext).Program);
    TVar1 = CCompilationContext::MaxTableSize(&peVar3->super_CCompilationContext);
    pCVar4 = (CStackData *)operator_new((long)(TVar2 * 0x20 + TVar1 * 8));
    this->stack = pCVar4;
    this->table = (CUnitNode **)((long)&pCVar4->left + (long)(TVar2 * 0x20));
    return;
  }
  __assert_fail("Program->MaxTableSize() >= 2",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/OperationsExecuter.cpp"
                ,0x98,"void Refal2::COperationsExecuter::allocateTableAndStack()");
}

Assistant:

void COperationsExecuter::allocateTableAndStack()
{
	assert( Program->MaxTableSize() >= 2 );
	const int stackBytes = sizeof( CStackData ) * Program->MaxStackDepth();
	const int tableBytes = sizeof( CUnitNode* ) * Program->MaxTableSize();
	void* memory = ::operator new( stackBytes + tableBytes );
	stack = static_cast<CStackData*>( memory );
	memory = static_cast<char*>( memory ) + stackBytes;
	table = static_cast<CUnitNode**>( memory );
}